

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::operator/=(path *this,path *p)

{
  path rhs;
  char *local_38 [4];
  
  if ((p->m_pathname)._M_string_length != 0) {
    if (this == p) {
      std::__cxx11::string::string((string *)local_38,(string *)p);
      if (*local_38[0] != '/') {
        m_append_separator_if_needed(this);
      }
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      if (*(p->m_pathname)._M_dataplus._M_p != '/') {
        m_append_separator_if_needed(this);
      }
      std::__cxx11::string::append((string *)this);
    }
  }
  return this;
}

Assistant:

path& path::operator/=(const path& p)
  {
    if (p.empty())
      return *this;
    if (this == &p)  // self-append
    {
      path rhs(p);
      if (!is_separator(rhs.m_pathname[0]))
        m_append_separator_if_needed();
      m_pathname += rhs.m_pathname;
    }
    else
    {
      if (!is_separator(*p.m_pathname.begin()))
        m_append_separator_if_needed();
      m_pathname += p.m_pathname;
    }
    return *this;
  }